

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2_p.h
# Opt level: O2

void * __thiscall QGles2CommandBuffer::retainData(QGles2CommandBuffer *this,QByteArray *data)

{
  undefined8 *puVar1;
  
  QVarLengthArray<QByteArray,_4LL>::append(&this->dataRetainPool,data);
  puVar1 = *(undefined8 **)
            ((long)(this->dataRetainPool).super_QVLABase<QByteArray>.super_QVLABaseBase.ptr +
            (this->dataRetainPool).super_QVLABase<QByteArray>.super_QVLABaseBase.s * 0x18 + -0x10);
  if (puVar1 == (undefined8 *)0x0) {
    puVar1 = &QByteArray::_empty;
  }
  return puVar1;
}

Assistant:

const void *retainData(const QByteArray &data) {
        dataRetainPool.append(data);
        return dataRetainPool.last().constData();
    }